

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeIterator.cpp
# Opt level: O3

Node * __thiscall NodeIterator::operator*(NodeIterator *this)

{
  set<EntryNode_*,_std::less<EntryNode_*>,_std::allocator<EntryNode_*>_> *psVar1;
  _Base_ptr p_Var2;
  
  if (this->forkNode == (ForkNode *)0x0) {
    if (this->exitNode != (ExitNode *)0x0) {
      psVar1 = (set<EntryNode_*,_std::less<EntryNode_*>,_std::allocator<EntryNode_*>_> *)
               ExitNode::joinSuccessors(this->exitNode);
      p_Var2 = (this->joinSuccessorsIterator)._M_node;
      goto LAB_00117d9d;
    }
  }
  else {
    psVar1 = ForkNode::forkSuccessors(this->forkNode);
    p_Var2 = (this->forkSuccessorsIterator)._M_node;
LAB_00117d9d:
    if ((_Rb_tree_header *)p_Var2 != &(psVar1->_M_t)._M_impl.super__Rb_tree_header)
    goto LAB_00117da6;
  }
  p_Var2 = (this->successorsIterator)._M_node;
LAB_00117da6:
  return *(Node **)(p_Var2 + 1);
}

Assistant:

Node *NodeIterator::operator*() const {
    if (forkNode) {
        if (forkSuccessorsIterator != forkNode->forkSuccessors().end()) {
            return *forkSuccessorsIterator;
        }
    } else if (exitNode) {
        if (joinSuccessorsIterator != exitNode->joinSuccessors().end()) {
            return *joinSuccessorsIterator;
        }
    }
    return *successorsIterator;
}